

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O1

void __thiscall
CVmObjFrameDesc::restore_from_file
          (CVmObjFrameDesc *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  vm_obj_id_t fref;
  char b_1 [2];
  char b_2 [2];
  char b [4];
  short local_30;
  ushort local_2e;
  vm_obj_id_t local_2c;
  
  CVmFile::read_bytes(fp,(char *)&local_2c,4);
  fref = CVmObjFixup::get_new_id(fixups,local_2c);
  CVmFile::read_bytes(fp,(char *)&local_30,2);
  CVmFile::read_bytes(fp,(char *)&local_2e,2);
  alloc_ext(this,fref,(int)local_30,(uint)local_2e);
  return;
}

Assistant:

void CVmObjFrameDesc::restore_from_file(VMG_ vm_obj_id_t self,
                                        class CVmFile *fp,
                                        class CVmObjFixup *fixups)
{
    /* read the values */
    vm_obj_id_t fref = fixups->get_new_id(vmg_ (vm_obj_id_t)fp->read_uint4());
    int frame_idx = fp->read_int2();
    uint ret_ofs = fp->read_uint2();

    /* allocate the extension */
    alloc_ext(vmg_ fref, frame_idx, ret_ofs);
}